

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharStringType2Interpreter.cpp
# Opt level: O2

Byte * __thiscall
CharStringType2Interpreter::InterpretNumber
          (CharStringType2Interpreter *this,Byte *inProgramCounter,LongFilePositionType inReadLimit)

{
  byte bVar1;
  ushort uVar2;
  int iVar3;
  Byte *pBVar4;
  double dVar5;
  CharStringOperand operand;
  long lStack_30;
  value_type local_28;
  
  if (inReadLimit < 1) {
    return (Byte *)0x0;
  }
  bVar1 = *inProgramCounter;
  if ((ulong)inReadLimit < 3 || (ulong)bVar1 != 0x1c) {
    if ((byte)(bVar1 - 0x20) < 0xd7) {
      local_28.IsInteger = true;
      local_28.field_1.IntegerValue = (ulong)bVar1 - 0x8b;
      lStack_30 = 1;
    }
    else {
      if (bVar1 < 0xf7) {
        return (Byte *)0x0;
      }
      if (inReadLimit == 1 || 0xfa < bVar1) {
        if (bVar1 < 0xfb) {
          return (Byte *)0x0;
        }
        if (bVar1 == 0xff || inReadLimit == 1) {
          if ((ulong)inReadLimit < 5 || bVar1 != 0xff) {
            return (Byte *)0x0;
          }
          local_28.IsInteger = false;
          uVar2 = *(ushort *)(inProgramCounter + 1) << 8 | *(ushort *)(inProgramCounter + 1) >> 8;
          dVar5 = (double)(ushort)(*(ushort *)(inProgramCounter + 3) << 8 |
                                  *(ushort *)(inProgramCounter + 3) >> 8) * 1.52587890625e-05;
          if ((short)uVar2 < 1) {
            dVar5 = -dVar5;
          }
          local_28.field_1.RealValue = dVar5 + (double)(int)(short)uVar2;
          lStack_30 = 5;
          goto LAB_001774b3;
        }
        local_28.field_1.IntegerValue = 0xfa94 - (ulong)CONCAT11(bVar1,inProgramCounter[1]);
      }
      else {
        local_28.field_1._0_4_ = ((uint)bVar1 * 0x100 + (uint)inProgramCounter[1]) - 0xf694;
        local_28.field_1.IntegerValue._4_4_ = 0;
      }
      local_28.IsInteger = true;
      lStack_30 = 2;
    }
  }
  else {
    local_28.IsInteger = true;
    local_28.field_1.IntegerValue =
         (long)(short)((ushort)inProgramCounter[1] << 8) | (ulong)inProgramCounter[2];
    lStack_30 = 3;
  }
LAB_001774b3:
  std::__cxx11::list<CharStringOperand,_std::allocator<CharStringOperand>_>::push_back
            (&this->mOperandStack,&local_28);
  iVar3 = (*this->mImplementationHelper->_vptr_IType2InterpreterImplementation[1])
                    (this->mImplementationHelper,&local_28);
  pBVar4 = (Byte *)0x0;
  if (iVar3 == 0) {
    pBVar4 = inProgramCounter + lStack_30;
  }
  return pBVar4;
}

Assistant:

Byte* CharStringType2Interpreter::InterpretNumber(Byte* inProgramCounter, LongFilePositionType inReadLimit)
{
	CharStringOperand operand;
	Byte* newPosition = inProgramCounter;

	if(inReadLimit < 1)
		return NULL; // error, cant read a single byte

	if(28 == *newPosition && inReadLimit >= 3)
	{
		operand.IsInteger = true;
		operand.IntegerValue = (short)(
									((unsigned short)(*(newPosition+1)) << 8) + (*(newPosition+2)));
		newPosition += 3;
	} 
	else if(32 <= *newPosition && *newPosition <= 246)
	{
		operand.IsInteger = true;
		operand.IntegerValue = (short)*newPosition - 139;
		++newPosition;
	}
	else if(247 <= *newPosition && *newPosition <= 250  && inReadLimit >= 2)
	{
		operand.IsInteger = true;
		operand.IntegerValue = (*newPosition - 247) * 256 + *(newPosition + 1) + 108;
		newPosition += 2;
	}
	else if(251 <= *newPosition && *newPosition <= 254  && inReadLimit >= 2)
	{
		operand.IsInteger = true;
		operand.IntegerValue = -(short)(*newPosition - 251) * 256 - *(newPosition + 1) - 108;
		newPosition += 2;
	}
	else if(255 == *newPosition  && inReadLimit >= 5)
	{
		operand.IsInteger = false;
		operand.RealValue = (short)(((unsigned short)(*(newPosition+1)) << 8) + (*(newPosition+2)));
			if(operand.RealValue > 0)
				operand.RealValue+=
					(double)(((unsigned short)(*(newPosition+3)) << 8) + (*(newPosition+4))) /
								(1 << 16);
			else
				operand.RealValue-=
					(double)(((unsigned short)(*(newPosition+3)) << 8) + (*(newPosition+4))) /
								(1 << 16);
		newPosition += 5;
	}
	else
		newPosition = NULL; // error

	if(newPosition)
	{
		mOperandStack.push_back(operand);
		EStatusCode status = mImplementationHelper->Type2InterpretNumber(operand);
		if(status != eSuccess)
			return NULL;

	}

	return newPosition;
}